

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::begin_array
          (basic_json_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor,
          error_code *ec)

{
  int iVar1;
  iterator __position;
  bool bVar2;
  parse_state local_1d;
  json_errc local_1c;
  
  iVar1 = this->level_;
  this->level_ = iVar1 + 1;
  if (this->max_nesting_depth_ <= iVar1) {
    local_1c = max_nesting_depth_exceeded;
    if ((this->err_handler_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    bVar2 = (*(this->err_handler_)._M_invoker)
                      ((_Any_data *)&this->err_handler_,&local_1c,&this->super_ser_context);
    this->more_ = bVar2;
    if (!bVar2) {
      std::error_code::operator=(ec,max_nesting_depth_exceeded);
      return;
    }
  }
  local_1d = array;
  __position._M_current =
       (this->state_stack_).
       super__Vector_base<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->state_stack_).
      super__Vector_base<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<jsoncons::parse_state,std::allocator<jsoncons::parse_state>>::
    _M_realloc_insert<jsoncons::parse_state_const&>
              ((vector<jsoncons::parse_state,std::allocator<jsoncons::parse_state>> *)
               &this->state_stack_,__position,&local_1d);
  }
  else {
    *__position._M_current = array;
    (this->state_stack_).
    super__Vector_base<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  this->state_ = expect_value_or_end;
  (*visitor->_vptr_basic_json_visitor[6])(visitor,0,this,ec);
  this->more_ = (bool)(this->cursor_mode_ ^ 1);
  return;
}

Assistant:

void begin_array(basic_json_visitor<char_type>& visitor, std::error_code& ec)
    {
        if (++level_ > max_nesting_depth_)
        {
            more_ = err_handler_(json_errc::max_nesting_depth_exceeded, *this);
            if (!more_)
            {
                ec = json_errc::max_nesting_depth_exceeded;
                return;
            }
        }

        push_state(parse_state::array);
        state_ = parse_state::expect_value_or_end;
        visitor.begin_array(semantic_tag::none, *this, ec);

        more_ = !cursor_mode_;
    }